

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Document::Document(Document *this,Stream *S)

{
  bool bVar1;
  mapped_type *pmVar2;
  Token local_d8;
  Token *local_a0;
  Token *T;
  size_t local_90;
  char *local_88;
  size_t local_80;
  key_type local_78;
  char *local_68;
  size_t local_60;
  Stream *local_58;
  Stream *S_local;
  Document *this_local;
  char **local_40;
  char *local_38;
  key_type *local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  Token **local_10;
  
  this->stream = S;
  local_58 = S;
  S_local = (Stream *)this;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
            (&this->NodeAllocator);
  this->Root = (Node *)0x0;
  std::
  map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
  ::map(&this->TagMap);
  local_40 = &local_68;
  this_local = (Document *)0x331c1c;
  local_68 = "!";
  local_60 = strlen("!");
  local_30 = &local_78;
  local_38 = "!";
  local_78.Data = "!";
  local_78.Length = strlen("!");
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,&local_78);
  pmVar2->Data = local_68;
  pmVar2->Length = local_60;
  local_20 = &local_88;
  local_28 = "tag:yaml.org,2002:";
  local_88 = "tag:yaml.org,2002:";
  local_80 = strlen("tag:yaml.org,2002:");
  local_10 = &T;
  local_18 = "!!";
  T = (Token *)0x32d811;
  local_90 = strlen("!!");
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)&T);
  pmVar2->Data = local_88;
  pmVar2->Length = local_80;
  bVar1 = parseDirectives(this);
  if (bVar1) {
    expectToken(this,5);
  }
  local_a0 = peekNext(this);
  if (local_a0->Kind == TK_DocumentStart) {
    getNext(&local_d8,this);
    Token::~Token(&local_d8);
  }
  return;
}

Assistant:

Document::Document(Stream &S) : stream(S), Root(nullptr) {
  // Tag maps starts with two default mappings.
  TagMap["!"] = "!";
  TagMap["!!"] = "tag:yaml.org,2002:";

  if (parseDirectives())
    expectToken(Token::TK_DocumentStart);
  Token &T = peekNext();
  if (T.Kind == Token::TK_DocumentStart)
    getNext();
}